

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void impl_GLSL_PushConstantArray(MOJOSHADER_glProgram *program,MOJOSHADER_uniform *u,GLfloat *f)

{
  GLint GVar1;
  GLint loc;
  GLfloat *f_local;
  MOJOSHADER_uniform *u_local;
  MOJOSHADER_glProgram *program_local;
  
  GVar1 = glsl_uniform_loc(program,u->name);
  if (-1 < GVar1) {
    (*ctx->glUniform4fv)(GVar1,u->array_count,f);
  }
  return;
}

Assistant:

static void impl_GLSL_PushConstantArray(MOJOSHADER_glProgram *program,
                                        const MOJOSHADER_uniform *u,
                                        const GLfloat *f)
{
    const GLint loc = glsl_uniform_loc(program, u->name);
    if (loc >= 0)   // not optimized out?
        ctx->glUniform4fv(loc, u->array_count, f);
}